

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

void __thiscall
gl4cts::FunctionObject::
binary<tcu::Matrix<double,_2,_4>,_tcu::Vector<double,_2>,_tcu::Vector<double,_4>_>::call
          (binary<tcu::Matrix<double,_2,_4>,_tcu::Vector<double,_2>,_tcu::Vector<double,_4>_> *this,
          GLvoid *result_dst,GLvoid *argument_src)

{
  code *pcVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  long lVar4;
  GLdouble *data;
  long lVar5;
  long lVar6;
  undefined1 *puVar7;
  bool bVar8;
  uint uVar9;
  Vector<double,_2> arg_1;
  Vector<double,_4> arg_2;
  Matrix<double,_2,_4> result;
  undefined8 local_a8 [9];
  undefined1 local_60 [64];
  
  lVar6 = 0;
  GPUShaderFP64Test10::functionObject::getArgumentStride((functionObject *)this,0);
  pcVar1 = (code *)(this->super_binaryBase).super_functionObject.m_p_function;
  puVar3 = local_a8;
  local_a8[6] = 0;
  local_a8[7] = 0;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      uVar9 = 0x3ff00000;
      if (lVar6 != lVar5) {
        uVar9 = 0;
      }
      *(ulong *)((long)puVar3 + lVar5) = (ulong)uVar9 << 0x20;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x40);
    puVar3 = puVar3 + 1;
    lVar6 = lVar6 + 0x10;
    bVar8 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar8);
  puVar7 = local_60;
  (*pcVar1)(puVar7);
  puVar3 = local_a8;
  lVar4 = 0;
  do {
    lVar6 = 0;
    do {
      *(undefined8 *)((long)puVar3 + lVar6) = *(undefined8 *)(puVar7 + lVar6);
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x40);
    puVar3 = puVar3 + 1;
    puVar7 = puVar7 + 8;
    bVar8 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar8);
  lVar4 = 0;
  do {
    uVar2 = *(undefined8 *)((long)local_a8 + lVar4 + 8);
    *(undefined8 *)((long)result_dst + lVar4) = *(undefined8 *)((long)local_a8 + lVar4);
    ((undefined8 *)((long)result_dst + lVar4))[1] = uVar2;
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x40);
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		const glw::GLuint argument_1_stride = getArgumentStride(0);

		functionPointer p_function = (functionPointer)m_p_function;

		Arg1T arg_1;
		Arg2T arg_2;
		ResT  result;

		unpack<Arg1T>::get(argument_src, arg_1);
		unpack<Arg2T>::get((glw::GLubyte*)argument_src + argument_1_stride, arg_2);

		result = p_function(arg_1, arg_2);

		pack<ResT>::set(result_dst, result);
	}